

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O2

int enet_socket_wait(ENetSocket socket,enet_uint32 *condition,enet_uint32 timeout)

{
  int iVar1;
  int *piVar2;
  enet_uint32 eVar3;
  pollfd local_10;
  
  local_10.events = ((ushort)*condition >> 1 & 1) + ((ushort)*condition & 1) * 4;
  local_10.fd = socket;
  iVar1 = poll(&local_10,1,timeout);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      return -1;
    }
    if ((*condition & 4) == 0) {
      return -1;
    }
    eVar3 = 4;
  }
  else {
    *condition = 0;
    if (iVar1 == 0) {
      return 0;
    }
    eVar3 = 1;
    if ((local_10.revents & 1U) != 0) {
      eVar3 = 3 - ((local_10.revents & 4U) == 0);
    }
    if ((local_10.revents & 5U) == 0) {
      return 0;
    }
  }
  *condition = eVar3;
  return 0;
}

Assistant:

int
enet_socket_wait (ENetSocket socket, enet_uint32 * condition, enet_uint32 timeout)
{
#ifdef HAS_POLL
    struct pollfd pollSocket;
    int pollCount;
    
    pollSocket.fd = socket;
    pollSocket.events = 0;

    if (* condition & ENET_SOCKET_WAIT_SEND)
      pollSocket.events |= POLLOUT;

    if (* condition & ENET_SOCKET_WAIT_RECEIVE)
      pollSocket.events |= POLLIN;

    pollCount = poll (& pollSocket, 1, timeout);

    if (pollCount < 0)
    {
        if (errno == EINTR && * condition & ENET_SOCKET_WAIT_INTERRUPT)
        {
            * condition = ENET_SOCKET_WAIT_INTERRUPT;

            return 0;
        }

        return -1;
    }

    * condition = ENET_SOCKET_WAIT_NONE;

    if (pollCount == 0)
      return 0;

    if (pollSocket.revents & POLLOUT)
      * condition |= ENET_SOCKET_WAIT_SEND;
    
    if (pollSocket.revents & POLLIN)
      * condition |= ENET_SOCKET_WAIT_RECEIVE;

    return 0;
#else
    fd_set readSet, writeSet;
    struct timeval timeVal;
    int selectCount;

    timeVal.tv_sec = timeout / 1000;
    timeVal.tv_usec = (timeout % 1000) * 1000;

    FD_ZERO (& readSet);
    FD_ZERO (& writeSet);

    if (* condition & ENET_SOCKET_WAIT_SEND)
      FD_SET (socket, & writeSet);

    if (* condition & ENET_SOCKET_WAIT_RECEIVE)
      FD_SET (socket, & readSet);

    selectCount = select (socket + 1, & readSet, & writeSet, NULL, & timeVal);

    if (selectCount < 0)
    {
        if (errno == EINTR && * condition & ENET_SOCKET_WAIT_INTERRUPT)
        {
            * condition = ENET_SOCKET_WAIT_INTERRUPT;

            return 0;
        }
      
        return -1;
    }

    * condition = ENET_SOCKET_WAIT_NONE;

    if (selectCount == 0)
      return 0;

    if (FD_ISSET (socket, & writeSet))
      * condition |= ENET_SOCKET_WAIT_SEND;

    if (FD_ISSET (socket, & readSet))
      * condition |= ENET_SOCKET_WAIT_RECEIVE;

    return 0;
#endif
}